

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::set_wheel(CImgDisplay *this,int amplitude)

{
  X11_static *pXVar1;
  int amplitude_local;
  CImgDisplay *this_local;
  
  this->_wheel = this->_wheel + amplitude;
  this->_is_event = (bool)(-(amplitude != 0) & 1);
  if (amplitude != 0) {
    pXVar1 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  }
  return this;
}

Assistant:

CImgDisplay& set_wheel(const int amplitude) {
      _wheel+=amplitude;
      _is_event = amplitude?true:false;
      if (amplitude) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }